

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O0

void jsoncons::jsonpointer::
     add_if_absent<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,char_const(&)[4]>
               (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *root,
               basic_json_pointer<char> *location,char (*value) [4],bool create_if_missing,
               error_code *ec)

{
  bool bVar1;
  reference pbVar2;
  long lVar3;
  char *pcVar4;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this_00;
  pointer this_01;
  byte in_CL;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDI;
  error_code *in_R8;
  undefined1 auVar5 [16];
  type tVar6;
  pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
  r;
  array_iterator it2;
  type result;
  size_t index;
  iterator end;
  iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> buffer;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *current;
  basic_json_pointer<char> *in_stack_fffffffffffffe28;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffe30;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar7;
  error_code *in_stack_fffffffffffffe40;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  char *in_stack_fffffffffffffe50;
  string_view_type *in_stack_fffffffffffffe70;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this_02;
  const_array_iterator pos;
  error_code *in_stack_fffffffffffffeb0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  string_view_type *in_stack_fffffffffffffec0;
  string_view_type *in_stack_fffffffffffffec8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  array_range_type local_e0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_d0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_c8;
  __normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  local_b8;
  char *local_b0;
  to_integer_errc local_a8;
  char *local_a0;
  to_integer_errc local_98;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_90;
  undefined4 local_84;
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> local_50 [2];
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_30;
  error_code *local_28;
  byte local_19;
  jsonpointer_errc __e;
  
  local_19 = in_CL & 1;
  local_30 = in_RDI;
  local_28 = in_R8;
  std::__cxx11::string::string((string *)local_50);
  local_58._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       basic_json_pointer<char>::begin_abi_cxx11_(in_stack_fffffffffffffe28);
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             basic_json_pointer<char>::end_abi_cxx11_(in_stack_fffffffffffffe28);
  do {
    do {
      bVar1 = __gnu_cxx::operator!=
                        (in_stack_fffffffffffffe30,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffe28);
      if (!bVar1) {
        bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                          (in_stack_fffffffffffffe48);
        if (bVar1) {
          lVar3 = std::__cxx11::string::size();
          if (lVar3 == 1) {
            pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_50);
            if (*pcVar4 == '-') {
              basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
              emplace_back<char_const(&)[4]>
                        (in_stack_fffffffffffffe78,(char (*) [4])in_stack_fffffffffffffe70);
              basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                        (in_stack_fffffffffffffe38);
              local_30 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                                   (in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0);
              goto LAB_00726159;
            }
          }
          local_90 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x0;
          pos._M_current = local_50;
          std::__cxx11::string::data();
          std::__cxx11::string::length();
          tVar6 = jsoncons::detail::dec_to_integer<unsigned_long,char>
                            (in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48,
                             (unsigned_long *)in_stack_fffffffffffffe40);
          pcVar4 = tVar6.ptr;
          local_a8 = tVar6.ec;
          local_b0 = pcVar4;
          local_a0 = pcVar4;
          local_98 = local_a8;
          bVar1 = jsoncons::detail::to_integer_result::operator_cast_to_bool
                            ((to_integer_result *)&local_a0);
          if (!bVar1) {
            std::error_code::operator=
                      (in_stack_fffffffffffffe40,
                       (jsonpointer_errc)((ulong)in_stack_fffffffffffffe38 >> 0x20));
            local_84 = 1;
            goto LAB_00726164;
          }
          pbVar7 = local_90;
          this = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                           (in_stack_fffffffffffffe38);
          if (this < pbVar7) {
            std::error_code::operator=
                      (in_stack_fffffffffffffe40,
                       (jsonpointer_errc)((ulong)in_stack_fffffffffffffe38 >> 0x20));
            local_84 = 1;
            goto LAB_00726164;
          }
          this_02 = local_90;
          this_00 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                              (in_stack_fffffffffffffe38);
          if (this_02 == this_00) {
            basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
            emplace_back<char_const(&)[4]>(this_02,(char (*) [4])in_stack_fffffffffffffe70);
            basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                      (in_stack_fffffffffffffe38);
            local_30 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                                 (in_stack_fffffffffffffeb8,(size_t)pcVar4);
          }
          else {
            local_e0 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                                 (this_00);
            local_d0 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                       range<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                       ::begin(&local_e0);
            local_c8 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                       __gnu_cxx::
                       __normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                       ::operator+((__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                                    *)in_stack_fffffffffffffe38,
                                   (difference_type)in_stack_fffffffffffffe30);
            __gnu_cxx::
            __normal_iterator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const*,std::vector<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
            ::
            __normal_iterator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>*>
                      ((__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffe30,
                       (__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffe28);
            local_b8._M_current =
                 (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
                 insert<char_const(&)[4]>(this,pos,pbVar7);
            local_30 = __gnu_cxx::
                       __normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                       ::operator*(&local_b8);
          }
        }
        else {
          bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object
                            (in_stack_fffffffffffffe48);
          if (!bVar1) {
            std::error_code::operator=
                      (in_stack_fffffffffffffe40,
                       (jsonpointer_errc)((ulong)in_stack_fffffffffffffe38 >> 0x20));
            local_84 = 1;
            goto LAB_00726164;
          }
          pbVar7 = local_30;
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
          __e = (jsonpointer_errc)((ulong)pbVar7 >> 0x20);
          bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                            (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
          if (bVar1) {
            std::error_code::operator=(in_stack_fffffffffffffe40,__e);
            local_84 = 1;
            goto LAB_00726164;
          }
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
          basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
          try_emplace<char_const(&)[4]>
                    (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                     (char (*) [4])in_stack_fffffffffffffec0);
          this_01 = jsoncons::detail::
                    random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
                    ::operator->((random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
                                  *)0x726126);
          local_30 = key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                     ::value(this_01);
        }
LAB_00726159:
        local_84 = 0;
        goto LAB_00726164;
      }
      pbVar2 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_58);
      std::__cxx11::string::operator=((string *)local_50,(string *)pbVar2);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_58);
      bVar1 = __gnu_cxx::operator!=
                        (in_stack_fffffffffffffe30,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffe28);
    } while (!bVar1);
    auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
    local_80 = auVar5;
    local_30 = detail::
               resolve<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                         ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                          in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                          SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0),
                          in_stack_fffffffffffffeb0);
    bVar1 = std::error_code::operator_cast_to_bool(local_28);
  } while (!bVar1);
  local_84 = 1;
LAB_00726164:
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void add_if_absent(Json& root, 
                       const basic_json_pointer<typename Json::char_type>& location, 
                       T&& value, 
                       bool create_if_missing,
                       std::error_code& ec)
    {
        Json* current = std::addressof(root);

        std::basic_string<typename Json::char_type> buffer;
        auto it = location.begin();
        auto end = location.end();

        while (it != end)
        {
            buffer = *it;
            ++it;
            if (it != end)
            {
                current = jsoncons::jsonpointer::detail::resolve(current, buffer, create_if_missing, ec);
                if (JSONCONS_UNLIKELY(ec))
                    return;
            }
        }
        if (current->is_array())
        {
            if (buffer.size() == 1 && buffer[0] == '-')
            {
                current->emplace_back(std::forward<T>(value));
                current = std::addressof(current->at(current->size()-1));
            }
            else
            {
                std::size_t index{0};
                auto result = jsoncons::detail::dec_to_integer(buffer.data(), buffer.length(), index);
                if (!result)
                {
                    ec = jsonpointer_errc::invalid_index;
                    return;
                }
                if (index > current->size())
                {
                    ec = jsonpointer_errc::index_exceeds_array_size;
                    return;
                }
                if (index == current->size())
                {
                    current->emplace_back(std::forward<T>(value));
                    current = std::addressof(current->at(current->size()-1));
                }
                else
                {
                    auto it2 = current->insert(current->array_range().begin()+index,std::forward<T>(value));
                    current = std::addressof(*it2);
                }
            }
        }
        else if (current->is_object())
        {
            if (current->contains(buffer))
            {
                ec = jsonpointer_errc::key_already_exists;
                return;
            }
            else
            {
                auto r = current->try_emplace(buffer,std::forward<T>(value));
                current = std::addressof(r.first->value());
            }
        }
        else
        {
            ec = jsonpointer_errc::expected_object_or_array;
            return;
        }
    }